

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int agent_transact_unix(LIBSSH2_AGENT *agent,agent_transaction_ctx_t transctx)

{
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  uchar *puVar4;
  uchar local_24 [4];
  int rc;
  uchar buf [4];
  agent_transaction_ctx_t transctx_local;
  LIBSSH2_AGENT *agent_local;
  
  _rc = transctx;
  if (transctx->state == agent_NB_state_request_created) {
    _libssh2_htonu32(local_24,(uint32_t)transctx->request_len);
    sVar3 = _send_all(agent->session->send,agent->fd,local_24,4,0,&agent->session->abstract);
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    if ((int)sVar3 < 0) {
      iVar1 = _libssh2_error(agent->session,-7,"agent send failed");
      return iVar1;
    }
    _rc->state = agent_NB_state_request_length_sent;
  }
  if (_rc->state == agent_NB_state_request_length_sent) {
    sVar3 = _send_all(agent->session->send,agent->fd,_rc->request,_rc->request_len,0,
                      &agent->session->abstract);
    if ((int)sVar3 == -0xb) {
      return -0x25;
    }
    if ((int)sVar3 < 0) {
      iVar1 = _libssh2_error(agent->session,-7,"agent send failed");
      return iVar1;
    }
    _rc->state = agent_NB_state_request_sent;
  }
  if (_rc->state == agent_NB_state_request_sent) {
    sVar3 = _recv_all(agent->session->recv,agent->fd,local_24,4,0,&agent->session->abstract);
    if ((int)sVar3 < 0) {
      if ((int)sVar3 == -0xb) {
        return -0x25;
      }
      iVar1 = _libssh2_error(agent->session,-0x2b,"agent recv failed");
      return iVar1;
    }
    uVar2 = _libssh2_ntohu32(local_24);
    _rc->response_len = (ulong)uVar2;
    puVar4 = (uchar *)(*agent->session->alloc)(_rc->response_len,&agent->session->abstract);
    _rc->response = puVar4;
    if (_rc->response == (uchar *)0x0) {
      return -6;
    }
    _rc->state = agent_NB_state_response_length_received;
  }
  if (_rc->state == agent_NB_state_response_length_received) {
    sVar3 = _recv_all(agent->session->recv,agent->fd,_rc->response,_rc->response_len,0,
                      &agent->session->abstract);
    if ((int)sVar3 < 0) {
      if ((int)sVar3 == -0xb) {
        return -0x25;
      }
      iVar1 = _libssh2_error(agent->session,-7,"agent recv failed");
      return iVar1;
    }
    _rc->state = agent_NB_state_response_received;
  }
  return 0;
}

Assistant:

static int
agent_transact_unix(LIBSSH2_AGENT *agent, agent_transaction_ctx_t transctx)
{
    unsigned char buf[4];
    int rc;

    /* Send the length of the request */
    if(transctx->state == agent_NB_state_request_created) {
        _libssh2_htonu32(buf, (uint32_t)transctx->request_len);
        rc = (int)_send_all(agent->session->send, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_length_sent;
    }

    /* Send the request body */
    if(transctx->state == agent_NB_state_request_length_sent) {
        rc = (int)_send_all(agent->session->send, agent->fd,
                            transctx->request, transctx->request_len, 0,
                            &agent->session->abstract);
        if(rc == -EAGAIN)
            return LIBSSH2_ERROR_EAGAIN;
        else if(rc < 0)
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent send failed");
        transctx->state = agent_NB_state_request_sent;
    }

    /* Receive the length of a response */
    if(transctx->state == agent_NB_state_request_sent) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            buf, sizeof(buf), 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_RECV,
                                  "agent recv failed");
        }
        transctx->response_len = _libssh2_ntohu32(buf);
        transctx->response = LIBSSH2_ALLOC(agent->session,
                                           transctx->response_len);
        if(!transctx->response)
            return LIBSSH2_ERROR_ALLOC;

        transctx->state = agent_NB_state_response_length_received;
    }

    /* Receive the response body */
    if(transctx->state == agent_NB_state_response_length_received) {
        rc = (int)_recv_all(agent->session->recv, agent->fd,
                            transctx->response, transctx->response_len, 0,
                            &agent->session->abstract);
        if(rc < 0) {
            if(rc == -EAGAIN)
                return LIBSSH2_ERROR_EAGAIN;
            return _libssh2_error(agent->session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "agent recv failed");
        }
        transctx->state = agent_NB_state_response_received;
    }

    return 0;
}